

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

bool __thiscall CppGenerator::requireHash(CppGenerator *this,size_t *view_id,size_t *rel_id)

{
  byte bVar1;
  long *in_RDX;
  QueryCompiler *in_RDI;
  size_t var;
  size_t orderIdx;
  View *view;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  bitset<100UL> *in_stack_ffffffffffffffb8;
  ulong local_38;
  long local_30;
  
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e33d6);
  QueryCompiler::getView(in_RDI,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  local_30 = 0;
  local_38 = 0;
  do {
    if (99 < local_38) {
      return false;
    }
    std::bitset<100UL>::operator[](in_stack_ffffffffffffffb8,(size_t)in_RDI);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_RDI);
    std::bitset<100UL>::reference::~reference((reference *)&stack0xffffffffffffffb8);
    if ((bVar1 & 1) != 0) {
      if (*(ulong *)((long)(in_RDI[1]._functionList.
                            super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                            super__Vector_impl_data._M_start[*in_RDX]->_fVars).
                           super__Base_bitset<2UL>._M_w + local_30 * 8) != local_38) {
        return true;
      }
      local_30 = local_30 + 1;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool CppGenerator::requireHash(const size_t& view_id, const size_t& rel_id)
{
    View* view = _qc->getView(view_id);
    size_t orderIdx = 0;
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (view->_fVars[var])
        {
            if (sortOrders[rel_id][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }
    
    return false;
}